

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_gpio_set_pud(uint8_t pin,uint8_t pud)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t *paddr;
  
  if (pud_type_rpi4 != '\x01') {
    bcm2835_gpio_pud(pud);
    bcm2835_delayMicroseconds(10);
    bcm2835_gpio_pudclk(pin,'\x01');
    bcm2835_delayMicroseconds(10);
    bcm2835_gpio_pud('\0');
    bcm2835_gpio_pudclk(pin,'\0');
    return;
  }
  if (pud < 3) {
    iVar1 = *(int *)(&DAT_00105140 + (ulong)pud * 4);
    paddr = bcm2835_gpio + (ulong)(pin >> 4) + 0x39;
    uVar2 = bcm2835_peri_read_nb(paddr);
    bcm2835_peri_write_nb
              (paddr,iVar1 << (pin * '\x02' & 0x1f) | ~(3 << (pin * '\x02' & 0x1f)) & uVar2);
    return;
  }
  return;
}

Assistant:

void bcm2835_gpio_set_pud(uint8_t pin, uint8_t pud)
{
    if( pud_type_rpi4 )
    {
        int shiftbits = (pin & 0xf) << 1;
        uint32_t bits;
        uint32_t pull;
        
        switch (pud)
        {
           case BCM2835_GPIO_PUD_OFF:  pull = 0; break;
           case BCM2835_GPIO_PUD_UP:   pull = 1; break;
           case BCM2835_GPIO_PUD_DOWN: pull = 2; break;
           default: return;
        }
                
        volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPPUPPDN0/4 + (pin >> 4);
        
        bits = bcm2835_peri_read_nb( paddr );
        bits &= ~(3 << shiftbits);
        bits |= (pull << shiftbits);
        
        bcm2835_peri_write_nb( paddr, bits );
        
    } else
    {
    bcm2835_gpio_pud(pud);
    delayMicroseconds(10);
    bcm2835_gpio_pudclk(pin, 1);
    delayMicroseconds(10);
    bcm2835_gpio_pud(BCM2835_GPIO_PUD_OFF);
    bcm2835_gpio_pudclk(pin, 0);
}

}